

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExteriorOrientation.cpp
# Opt level: O0

matrix * __thiscall
ExteriorOrientation::get_transformation(matrix *__return_storage_ptr__,ExteriorOrientation *this)

{
  allocator<double> *paVar1;
  allocator<std::vector<double,_std::allocator<double>_>_> *paVar2;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_02;
  initializer_list<double> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_06;
  initializer_list<double> __l_07;
  initializer_list<double> __l_08;
  initializer_list<double> __l_09;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_10;
  reference pvVar3;
  double __x;
  double __x_00;
  vector<double,_std::allocator<double>_> *local_498;
  vector<double,_std::allocator<double>_> *local_448;
  vector<double,_std::allocator<double>_> *local_3f8;
  matrix local_398;
  undefined1 local_37c;
  allocator<std::vector<double,_std::allocator<double>_>_> local_37b;
  undefined1 local_37a;
  allocator<double> local_379;
  double local_378 [4];
  iterator local_358;
  size_type local_350;
  allocator<double> local_341;
  double local_340;
  double local_338;
  undefined8 local_330;
  iterator local_328;
  size_type local_320;
  allocator<double> local_311;
  double local_310;
  double local_308;
  undefined8 local_300;
  iterator local_2f8;
  size_type local_2f0;
  vector<double,_std::allocator<double>_> *local_2e8;
  vector<double,_std::allocator<double>_> local_2e0;
  vector<double,_std::allocator<double>_> local_2c8;
  vector<double,_std::allocator<double>_> local_2b0;
  undefined1 local_298 [24];
  matrix rotationZ;
  double local_268;
  double local_260;
  double local_258;
  iterator local_250;
  size_type local_248;
  allocator<double> local_239;
  double local_238;
  double local_230;
  double local_228;
  iterator local_220;
  size_type local_218;
  allocator<double> local_209;
  double local_208 [4];
  iterator local_1e8;
  size_type local_1e0;
  vector<double,_std::allocator<double>_> *local_1d8;
  vector<double,_std::allocator<double>_> local_1d0;
  vector<double,_std::allocator<double>_> local_1b8;
  vector<double,_std::allocator<double>_> local_1a0;
  undefined1 local_188 [24];
  matrix rotationX;
  double local_158 [3];
  iterator local_140;
  size_type local_138;
  allocator<double> local_129;
  double local_128 [4];
  iterator local_108;
  size_type local_100;
  allocator<double> local_e1;
  double local_e0 [3];
  iterator local_c8;
  size_type local_c0;
  vector<double,_std::allocator<double>_> *local_b8;
  vector<double,_std::allocator<double>_> local_b0;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_80;
  undefined1 local_68 [24];
  matrix rotationY;
  double z;
  double x;
  double y;
  int rotDir;
  double deg_to_rad;
  ExteriorOrientation *this_local;
  matrix *RM;
  
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->_rotation,1);
  __x = *pvVar3 * 0.017453292519943295 * -1.0;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->_rotation,0);
  __x_00 = *pvVar3 * 0.017453292519943295 * -1.0;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->_rotation,2);
  rotationY.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(*pvVar3 * 0.017453292519943295 * -1.0);
  rotationX.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_b8 = &local_b0;
  local_e0[0] = cos(__x);
  local_e0[1] = 0.0;
  local_e0[2] = sin(__x);
  local_c8 = local_e0;
  local_c0 = 3;
  std::allocator<double>::allocator(&local_e1);
  __l_09._M_len = local_c0;
  __l_09._M_array = local_c8;
  std::vector<double,_std::allocator<double>_>::vector(&local_b0,__l_09,&local_e1);
  local_128[0] = 0.0;
  local_128[1] = 1.0;
  local_128[2] = 0.0;
  local_108 = local_128;
  local_100 = 3;
  local_b8 = &local_98;
  std::allocator<double>::allocator(&local_129);
  __l_08._M_len = local_100;
  __l_08._M_array = local_108;
  std::vector<double,_std::allocator<double>_>::vector(&local_98,__l_08,&local_129);
  local_b8 = &local_80;
  local_158[0] = sin(__x);
  local_158[0] = -local_158[0];
  local_158[1] = 0.0;
  local_158[2] = cos(__x);
  local_140 = local_158;
  local_138 = 3;
  paVar1 = (allocator<double> *)
           ((long)&rotationX.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  __l_07._M_len = local_138;
  __l_07._M_array = local_140;
  std::vector<double,_std::allocator<double>_>::vector(&local_80,__l_07,paVar1);
  rotationX.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_68._0_8_ = &local_b0;
  local_68._8_8_ = (pointer)0x3;
  paVar2 = (allocator<std::vector<double,_std::allocator<double>_>_> *)
           ((long)&rotationX.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(paVar2);
  __l_10._M_len = local_68._8_8_;
  __l_10._M_array = (iterator)local_68._0_8_;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)(local_68 + 0x10),__l_10,paVar2);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)
             ((long)&rotationX.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_3f8 = (vector<double,_std::allocator<double>_> *)local_68;
  do {
    local_3f8 = local_3f8 + -1;
    std::vector<double,_std::allocator<double>_>::~vector(local_3f8);
  } while (local_3f8 != &local_b0);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&rotationX.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<double>::~allocator(&local_129);
  std::allocator<double>::~allocator(&local_e1);
  rotationZ.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_208[0] = 1.0;
  local_208[1] = 0.0;
  local_208[2] = 0.0;
  local_1e8 = local_208;
  local_1e0 = 3;
  local_1d8 = &local_1d0;
  std::allocator<double>::allocator(&local_209);
  __l_05._M_len = local_1e0;
  __l_05._M_array = local_1e8;
  std::vector<double,_std::allocator<double>_>::vector(&local_1d0,__l_05,&local_209);
  local_238 = 0.0;
  local_1d8 = &local_1b8;
  local_230 = cos(__x_00);
  local_228 = sin(__x_00);
  local_228 = -local_228;
  local_220 = &local_238;
  local_218 = 3;
  std::allocator<double>::allocator(&local_239);
  __l_04._M_len = local_218;
  __l_04._M_array = local_220;
  std::vector<double,_std::allocator<double>_>::vector(&local_1b8,__l_04,&local_239);
  local_268 = 0.0;
  local_1d8 = &local_1a0;
  local_260 = sin(__x_00);
  local_258 = cos(__x_00);
  local_250 = &local_268;
  local_248 = 3;
  paVar1 = (allocator<double> *)
           ((long)&rotationZ.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  __l_03._M_len = local_248;
  __l_03._M_array = local_250;
  std::vector<double,_std::allocator<double>_>::vector(&local_1a0,__l_03,paVar1);
  rotationZ.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_188._0_8_ = &local_1d0;
  local_188._8_8_ = (pointer)0x3;
  paVar2 = (allocator<std::vector<double,_std::allocator<double>_>_> *)
           ((long)&rotationZ.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(paVar2);
  __l_06._M_len = local_188._8_8_;
  __l_06._M_array = (iterator)local_188._0_8_;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)(local_188 + 0x10),__l_06,paVar2);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)
             ((long)&rotationZ.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_448 = (vector<double,_std::allocator<double>_> *)local_188;
  do {
    local_448 = local_448 + -1;
    std::vector<double,_std::allocator<double>_>::~vector(local_448);
  } while (local_448 != &local_1d0);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&rotationZ.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<double>::~allocator(&local_239);
  std::allocator<double>::~allocator(&local_209);
  local_37a = 1;
  local_2e8 = &local_2e0;
  local_310 = cos((double)rotationY.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_308 = sin((double)rotationY.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_308 = -local_308;
  local_300 = 0;
  local_2f8 = &local_310;
  local_2f0 = 3;
  std::allocator<double>::allocator(&local_311);
  __l_01._M_len = local_2f0;
  __l_01._M_array = local_2f8;
  std::vector<double,_std::allocator<double>_>::vector(&local_2e0,__l_01,&local_311);
  local_2e8 = &local_2c8;
  local_340 = sin((double)rotationY.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_338 = cos((double)rotationY.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_330 = 0;
  local_328 = &local_340;
  local_320 = 3;
  std::allocator<double>::allocator(&local_341);
  __l_00._M_len = local_320;
  __l_00._M_array = local_328;
  std::vector<double,_std::allocator<double>_>::vector(&local_2c8,__l_00,&local_341);
  local_378[2] = 1.0;
  local_378[0] = 0.0;
  local_378[1] = 0.0;
  local_358 = local_378;
  local_350 = 3;
  local_2e8 = &local_2b0;
  std::allocator<double>::allocator(&local_379);
  __l._M_len = local_350;
  __l._M_array = local_358;
  std::vector<double,_std::allocator<double>_>::vector(&local_2b0,__l,&local_379);
  local_37a = 0;
  local_298._0_8_ = &local_2e0;
  local_298._8_8_ = (pointer)0x3;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_37b);
  __l_02._M_len = local_298._8_8_;
  __l_02._M_array = (iterator)local_298._0_8_;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)(local_298 + 0x10),__l_02,&local_37b);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_37b);
  local_498 = (vector<double,_std::allocator<double>_> *)local_298;
  do {
    local_498 = local_498 + -1;
    std::vector<double,_std::allocator<double>_>::~vector(local_498);
  } while (local_498 != &local_2e0);
  std::allocator<double>::~allocator(&local_379);
  std::allocator<double>::~allocator(&local_341);
  std::allocator<double>::~allocator(&local_311);
  local_37c = 0;
  multiply(&local_398,(matrix *)(local_188 + 0x10),(matrix *)(local_68 + 0x10));
  multiply(__return_storage_ptr__,&local_398,(matrix *)(local_298 + 0x10));
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_398);
  local_37c = 1;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)(local_298 + 0x10));
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)(local_188 + 0x10));
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)(local_68 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

matrix ExteriorOrientation::get_transformation()
{
    const double deg_to_rad = M_PI / 180.0;

    //Rotation direction
    int rotDir = -1;

    //Matrices for rotations around various axes
    const double y = ExteriorOrientation::_rotation[1] * deg_to_rad * rotDir;
    const double x = ExteriorOrientation::_rotation[0] * deg_to_rad * rotDir;
    const double z = ExteriorOrientation::_rotation[2] * deg_to_rad * rotDir;

    /* matlab code/comment:
            rty=[cos(pitch*degtorad_i),0, sin(pitch*degtorad_i);
            0 , 1, 0;
            -sin(pitch*degtorad_i),0,cos(pitch*degtorad_i)];*/



    const matrix rotationY = {{cos(y),  0, sin(y)},
                              {0,       1, 0},
                              {-sin(y), 0, cos(y)}};


    /* matlab code/comment:
    %Rotation x
    rtx=[1,0,0;
    0, cos(roll*degtorad_i),-sin(roll*degtorad_i);
    0, sin(roll*degtorad_i),cos(roll*degtorad_i)];
    %Rotation z
    */

    const matrix rotationX = {{1, 0,      0},
                              {0, cos(x), -sin(x)},
                              {0, sin(x), cos(x)}};

/*  matlab code/comment:
    rtz=[cos(yaw*degtorad_i),-sin(yaw*degtorad_i),0;
            sin(yaw*degtorad_i),cos(yaw*degtorad_i),0;
            0,0,1];

*/
    const matrix rotationZ = {{cos(z), -sin(z), 0},
                              {sin(z), cos(z),  0},
                              {0,      0,       1}};


    //Finally:  RM=rty*rtx*rtz;
    //Implement the above as (y*x)*z, by using the matrix multiplication method... we should consider using a class with the * operator, for convenience
    matrix RM = multiply(multiply(rotationX, rotationY), rotationZ);


    return RM; //Rotation matrix.
}